

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

HierarchyCPT * __thiscall
despot::Parser::CreateHierarchyStateTransition(Parser *this,TiXmlElement *e_CondProb)

{
  NamedVar *child_00;
  value_type pNVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  TiXmlNode *pTVar5;
  mapped_type *ppVVar6;
  ulong uVar7;
  size_type sVar8;
  reference pvVar9;
  HierarchyCPT *pHVar10;
  TiXmlElement *pTVar11;
  char *pcVar12;
  reference ppNVar13;
  reference pvVar14;
  double dVar15;
  bool local_492;
  allocator<char> local_451;
  string local_450;
  undefined1 local_429;
  iterator iStack_428;
  bool success;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_420;
  const_iterator local_418;
  string local_410;
  uint local_3ec;
  int local_3e8;
  int val_1;
  int i_2;
  undefined1 local_3c0 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  value_tokens;
  string table;
  vector<double,_std::allocator<double>_> values;
  string local_368;
  string local_348;
  undefined1 local_328 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  instance;
  TiXmlElement *e_Entry;
  TiXmlElement *e_Parameter;
  value_type local_2e8;
  int local_2dc;
  undefined1 local_2d8 [4];
  int i_1;
  vector<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_> vars;
  allocator<char> local_299;
  int val;
  allocator<char> local_271;
  string local_270;
  undefined1 local_250 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tokens;
  TiXmlElement *e_Vars;
  TiXmlElement *e_Dependency;
  vector<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_> local_220;
  HierarchyCPT *local_208;
  HierarchyCPT *func;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  byte local_1b1;
  string local_1b0;
  byte local_189;
  string local_188;
  string local_168;
  undefined1 local_148 [8];
  string parent_name;
  int i;
  string local_100;
  undefined1 local_e0 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  parent_names;
  vector<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_> parents;
  StateVar *child;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  string local_58;
  undefined1 local_38 [8];
  string name;
  TiXmlElement *e_CondProb_local;
  Parser *this_local;
  
  name.field_2._8_8_ = e_CondProb;
  GetFirstChildText_abi_cxx11_((string *)local_38,this,e_CondProb,"Var");
  std::__cxx11::string::string((string *)&local_58,(string *)local_38);
  bVar2 = Variable::IsVariableName(&local_58,&this->curr_state_vars_);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&child,
                 "In <StateTransitionFunction>: Var ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38);
  std::operator+(&local_88,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&child,
                 " has not been declared as a StateVar vnameCurr within the <Variable> tag.");
  pTVar5 = util::tinyxml::TiXmlNode::FirstChild((TiXmlNode *)name.field_2._8_8_,"Var");
  Ensure(this,bVar2,&local_88,&pTVar5->super_TiXmlBase);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&child);
  std::__cxx11::string::~string((string *)&local_58);
  ppVVar6 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_despot::Variable_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_despot::Variable_*>_>_>
            ::operator[](&this->variables_,(key_type *)local_38);
  child_00 = (NamedVar *)*ppVVar6;
  std::vector<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>::vector
            ((vector<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_> *)
             &parent_names.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  GetFirstChildText_abi_cxx11_(&local_100,this,(TiXmlElement *)name.field_2._8_8_,"Parent");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&i," ",(allocator<char> *)(parent_name.field_2._M_local_buf + 0xf));
  Tokenize((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_e0,&local_100,(string *)&i);
  std::__cxx11::string::~string((string *)&i);
  std::allocator<char>::~allocator((allocator<char> *)(parent_name.field_2._M_local_buf + 0xf));
  std::__cxx11::string::~string((string *)&local_100);
  for (parent_name.field_2._8_4_ = 0; uVar7 = (ulong)(int)parent_name.field_2._8_4_,
      sVar8 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_e0), uVar7 < sVar8;
      parent_name.field_2._8_4_ = parent_name.field_2._8_4_ + 1) {
    pvVar9 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_e0,(long)(int)parent_name.field_2._8_4_);
    std::__cxx11::string::string((string *)local_148,(string *)pvVar9);
    local_189 = 0;
    local_1b1 = 0;
    std::__cxx11::string::string((string *)&local_168,(string *)local_148);
    bVar2 = Variable::IsVariableName(&local_168,&this->prev_state_vars_);
    local_492 = true;
    if (!bVar2) {
      std::__cxx11::string::string((string *)&local_188,(string *)local_148);
      local_189 = 1;
      bVar2 = Variable::IsVariableName(&local_188,&this->curr_state_vars_);
      local_492 = true;
      if (!bVar2) {
        std::__cxx11::string::string((string *)&local_1b0,(string *)local_148);
        local_1b1 = 1;
        local_492 = Variable::IsVariableName(&local_1b0,&this->action_vars_);
      }
    }
    std::operator+(&local_1f8,"In <StateTransitionFunction>: Parent ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_148);
    std::operator+(&local_1d8,&local_1f8,
                   " has not been declared as a StateVar vnamePrev/vnameCurr or an ActionVar vname within the <Variable> tag."
                  );
    pTVar5 = util::tinyxml::TiXmlNode::FirstChild((TiXmlNode *)name.field_2._8_8_,"Parent");
    Ensure(this,local_492,&local_1d8,&pTVar5->super_TiXmlBase);
    std::__cxx11::string::~string((string *)&local_1d8);
    std::__cxx11::string::~string((string *)&local_1f8);
    if ((local_1b1 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_1b0);
    }
    if ((local_189 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_188);
    }
    std::__cxx11::string::~string((string *)&local_168);
    ppVVar6 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_despot::Variable_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_despot::Variable_*>_>_>
              ::operator[](&this->variables_,(key_type *)local_148);
    func = (HierarchyCPT *)*ppVVar6;
    std::vector<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>::push_back
              ((vector<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_> *)
               &parent_names.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,(value_type *)&func);
    std::__cxx11::string::~string((string *)local_148);
  }
  pHVar10 = (HierarchyCPT *)operator_new(0x70);
  std::vector<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>::vector
            (&local_220,
             (vector<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_> *)
             &parent_names.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  HierarchyCPT::HierarchyCPT(pHVar10,child_00,&local_220);
  std::vector<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>::~vector(&local_220);
  local_208 = pHVar10;
  pTVar11 = GetFirstChildElement(this,(TiXmlElement *)name.field_2._8_8_,"Dependency");
  tokens.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)GetFirstChildElement(this,pTVar11,"Vars");
  while (tokens.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    pcVar12 = util::tinyxml::TiXmlElement::GetText
                        ((TiXmlElement *)
                         tokens.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_270,pcVar12,&local_271);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&val," ",&local_299);
    Tokenize((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_250,&local_270,(string *)&val);
    std::__cxx11::string::~string((string *)&val);
    std::allocator<char>::~allocator(&local_299);
    std::__cxx11::string::~string((string *)&local_270);
    std::allocator<char>::~allocator(&local_271);
    ppNVar13 = std::vector<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>::operator[]
                         ((vector<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_> *)
                          &parent_names.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage,0);
    pNVar1 = *ppNVar13;
    pvVar9 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_250,0);
    std::__cxx11::string::string
              ((string *)
               &vars.super__Vector_base<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,(string *)pvVar9);
    iVar3 = Variable::IndexOf(&pNVar1->super_Variable,
                              (string *)
                              &vars.
                               super__Vector_base<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::__cxx11::string::~string
              ((string *)
               &vars.super__Vector_base<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    std::vector<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>::vector
              ((vector<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_> *)local_2d8);
    for (local_2dc = 1; uVar7 = (ulong)local_2dc,
        sVar8 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_250), pHVar10 = local_208, uVar7 < sVar8; local_2dc = local_2dc + 1)
    {
      pvVar9 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_250,(long)local_2dc);
      ppVVar6 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_despot::Variable_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_despot::Variable_*>_>_>
                ::operator[](&this->variables_,pvVar9);
      local_2e8 = (value_type)*ppVVar6;
      std::vector<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>::push_back
                ((vector<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_> *)local_2d8,
                 &local_2e8);
    }
    std::vector<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>::vector
              ((vector<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_> *)&e_Parameter,
               (vector<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_> *)local_2d8);
    HierarchyCPT::SetParents
              (pHVar10,iVar3,
               (vector<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_> *)&e_Parameter);
    std::vector<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>::~vector
              ((vector<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_> *)&e_Parameter);
    tokens.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)util::tinyxml::TiXmlNode::NextSiblingElement
                            ((TiXmlNode *)
                             tokens.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::vector<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>::~vector
              ((vector<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_> *)local_2d8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_250);
  }
  pTVar11 = GetParameterElement(this,(TiXmlElement *)name.field_2._8_8_);
  instance.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)util::tinyxml::TiXmlNode::FirstChildElement(&pTVar11->super_TiXmlNode,"Entry");
  while (pHVar10 = local_208,
        instance.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    GetFirstChildText_abi_cxx11_
              (&local_348,this,
               (TiXmlElement *)
               instance.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage,"Instance");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_368," ",
               (allocator<char> *)
               ((long)&values.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 7));
    Tokenize((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_328,&local_348,&local_368);
    std::__cxx11::string::~string((string *)&local_368);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&values.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 7));
    std::__cxx11::string::~string((string *)&local_348);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)((long)&table.field_2 + 8));
    GetFirstChildText_abi_cxx11_
              ((string *)
               &value_tokens.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,this,
               (TiXmlElement *)
               instance.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage,"ProbTable");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&i_2," ",(allocator<char> *)((long)&val_1 + 3));
    Tokenize((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_3c0,
             (string *)
             &value_tokens.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)&i_2);
    std::__cxx11::string::~string((string *)&i_2);
    std::allocator<char>::~allocator((allocator<char> *)((long)&val_1 + 3));
    sVar8 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_3c0);
    std::vector<double,_std::allocator<double>_>::resize
              ((vector<double,_std::allocator<double>_> *)((long)&table.field_2 + 8),sVar8);
    for (local_3e8 = 0; uVar7 = (ulong)local_3e8,
        sVar8 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_3c0), uVar7 < sVar8; local_3e8 = local_3e8 + 1) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_3c0,(long)local_3e8);
      pcVar12 = (char *)std::__cxx11::string::c_str();
      dVar15 = atof(pcVar12);
      pvVar14 = std::vector<double,_std::allocator<double>_>::operator[]
                          ((vector<double,_std::allocator<double>_> *)((long)&table.field_2 + 8),
                           (long)local_3e8);
      *pvVar14 = dVar15;
    }
    ppNVar13 = std::vector<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>::operator[]
                         ((vector<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_> *)
                          &parent_names.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage,0);
    pNVar1 = *ppNVar13;
    pvVar9 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_328,0);
    std::__cxx11::string::string((string *)&local_410,(string *)pvVar9);
    uVar4 = Variable::IndexOf(&pNVar1->super_Variable,&local_410);
    std::__cxx11::string::~string((string *)&local_410);
    local_3ec = uVar4;
    local_420._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_328);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
    ::__normal_iterator<std::__cxx11::string*>
              ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                *)&local_418,&local_420);
    iStack_428 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::erase((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_328,local_418);
    iVar3 = (*(local_208->super_CPT).super_Function._vptr_Function[0x12])
                      (local_208,(ulong)local_3ec,local_328,(undefined1 *)((long)&table.field_2 + 8)
                      );
    bVar2 = (bool)((byte)iVar3 & 1);
    local_429 = bVar2;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_450,"In <StateTransitionFunction>: Value assignment failed.",
               &local_451);
    pTVar11 = GetFirstChildElement
                        (this,(TiXmlElement *)
                              instance.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,"Instance");
    Ensure(this,bVar2,&local_450,(TiXmlBase *)pTVar11);
    std::__cxx11::string::~string((string *)&local_450);
    std::allocator<char>::~allocator(&local_451);
    instance.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)util::tinyxml::TiXmlNode::NextSiblingElement
                            ((TiXmlNode *)
                             instance.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_3c0);
    std::__cxx11::string::~string
              ((string *)
               &value_tokens.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)((long)&table.field_2 + 8));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_328);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_e0);
  std::vector<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>::~vector
            ((vector<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_> *)
             &parent_names.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string((string *)local_38);
  return pHVar10;
}

Assistant:

HierarchyCPT* Parser::CreateHierarchyStateTransition(TiXmlElement* e_CondProb) {
	// <Var>
	string name = GetFirstChildText(e_CondProb, "Var");

	Ensure(Variable::IsVariableName(name, curr_state_vars_),
		"In <StateTransitionFunction>: Var " + name
			+ " has not been declared as a StateVar vnameCurr within the <Variable> tag.",
		e_CondProb->FirstChild("Var"));

	StateVar* child = static_cast<StateVar*>(variables_[name]);

	// <Parent>
	vector<NamedVar*> parents;
	vector<string> parent_names = Tokenize(
		GetFirstChildText(e_CondProb, "Parent"));
	for (int i = 0; i < parent_names.size(); i++) {
		string parent_name = parent_names[i];
		Ensure(
			Variable::IsVariableName(parent_name, prev_state_vars_)
				|| Variable::IsVariableName(parent_name, curr_state_vars_)
				|| Variable::IsVariableName(parent_name, action_vars_),
			"In <StateTransitionFunction>: Parent " + parent_name
				+ " has not been declared as a StateVar vnamePrev/vnameCurr or an ActionVar vname within the <Variable> tag.",
			e_CondProb->FirstChild("Parent"));

		parents.push_back(static_cast<StateVar*>(variables_[parent_name]));
	}

	HierarchyCPT* func = new HierarchyCPT(child, parents);

	TiXmlElement* e_Dependency = GetFirstChildElement(e_CondProb, "Dependency");
	TiXmlElement* e_Vars = GetFirstChildElement(e_Dependency, "Vars");
	while (e_Vars != NULL) {
		vector<string> tokens = Tokenize(e_Vars->GetText());
		int val = parents[0]->IndexOf(tokens[0]);
		vector<NamedVar*> vars;
		for (int i = 1; i < tokens.size(); i++)
			vars.push_back(static_cast<NamedVar*>(variables_[tokens[i]]));
		func->SetParents(val, vars);

		e_Vars = e_Vars->NextSiblingElement();
	}

	// <Parameter>
	TiXmlElement* e_Parameter = GetParameterElement(e_CondProb);
	TiXmlElement* e_Entry = e_Parameter->FirstChildElement("Entry");
	while (e_Entry != NULL) {
		// <Instance>
		vector<string> instance = Tokenize(
			GetFirstChildText(e_Entry, "Instance"));

		// <ProbTable>
		vector<double> values;
		string table = GetFirstChildText(e_Entry, "ProbTable");

		vector<string> value_tokens = Tokenize(table);

		values.resize(value_tokens.size());
		for (int i = 0; i < value_tokens.size(); i++) {
			values[i] = atof(value_tokens[i].c_str());
		}

		int val = parents[0]->IndexOf(instance[0]);
		instance.erase(instance.begin());
		bool success = func->SetValue(val, instance, values);

		Ensure(success,
			"In <StateTransitionFunction>: Value assignment failed.",
			GetFirstChildElement(e_Entry, "Instance"));

		e_Entry = e_Entry->NextSiblingElement();
	}

	return func;
}